

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O1

void Aig_ManStopReverseLevels(Aig_Man_t *p)

{
  Vec_Int_t *__ptr;
  
  __ptr = p->vLevelR;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
    p->vLevelR = (Vec_Int_t *)0x0;
    p->nLevelMax = 0;
    return;
  }
  __assert_fail("p->vLevelR != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTiming.c"
                ,0xb1,"void Aig_ManStopReverseLevels(Aig_Man_t *)");
}

Assistant:

void Aig_ManStopReverseLevels( Aig_Man_t * p )
{
    assert( p->vLevelR != NULL );
    Vec_IntFree( p->vLevelR );
    p->vLevelR = NULL;
    p->nLevelMax = 0;

}